

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O1

int libj1939_ifindex(char *str)

{
  uint uVar1;
  if_nameindex *piVar2;
  if_nameindex *__ptr;
  int iVar3;
  long lVar4;
  char **ppcVar5;
  char *endp;
  char *local_30 [6];
  
  while( true ) {
    piVar2 = saved;
    lVar4 = strtol(str,local_30,0);
    if (*local_30[0] == '\0') {
      return (int)lVar4;
    }
    if ((saved == (if_nameindex *)0x0) &&
       (saved = (if_nameindex *)if_nameindex(), saved == (if_nameindex *)0x0)) {
      err(1,"if_nameindex()");
    }
    __ptr = saved;
    uVar1 = saved->if_index;
    if (uVar1 != 0) {
      iVar3 = strcmp(saved->if_name,str);
      if (iVar3 == 0) {
        return uVar1;
      }
      ppcVar5 = &__ptr[1].if_name;
      while (uVar1 = ((if_nameindex *)(ppcVar5 + -1))->if_index, uVar1 != 0) {
        iVar3 = strcmp(*ppcVar5,str);
        ppcVar5 = ppcVar5 + 2;
        if (iVar3 == 0) {
          return uVar1;
        }
      }
    }
    if (piVar2 == (if_nameindex *)0x0) break;
    if_freenameindex((if_nameindex *)__ptr);
    saved = (if_nameindex *)0x0;
  }
  return 0;
}

Assistant:

static int libj1939_ifindex(const char *str)
{
	const struct if_nameindex *lp, *cached = saved;
	char *endp;
	int ret;

	ret = strtol(str, &endp, 0);
	if (!*endp)
		/* did some good parse */
		return ret;

	fetch_names();
	for (lp = saved; lp->if_index; ++lp) {
		if (!strcmp(lp->if_name, str))
			return lp->if_index;
	}
	if (cached) {
		libj1939_cleanup();
		return libj1939_ifindex(str);
	}
	return 0;
}